

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O3

int Fxch_TabSingleDivisors(Fxch_Man_t *p,int iCube,int fAdd)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  if ((-1 < iCube) && (iCube < (p->vCubes).nSize)) {
    pVVar1 = (p->vCubes).pArray;
    iVar4 = pVVar1[(uint)iCube].nSize;
    iVar2 = 0;
    if (1 < iVar4) {
      lVar6 = 1;
      lVar7 = 0;
      do {
        lVar5 = lVar7 + 1;
        lVar3 = (long)iVar4;
        if (lVar5 < lVar3) {
          iVar2 = pVVar1[(uint)iCube].pArray[lVar7];
          lVar7 = lVar6;
          do {
            iVar4 = pVVar1[(uint)iCube].pArray[lVar7];
            if (iVar4 <= iVar2) {
              __assert_fail("Lit < Lit2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                            ,0x22f,"int Fxch_TabSingleDivisors(Fxch_Man_t *, int, int)");
            }
            if (fAdd == 0) {
              Fxch_DivisorRemove(p,iVar2,iVar4,1);
              iVar8 = -1;
            }
            else {
              iVar8 = 1;
              Fxch_DivisorAdd(p,iVar2,iVar4,1);
            }
            p->nPairsS = p->nPairsS + iVar8;
            lVar7 = lVar7 + 1;
            iVar4 = pVVar1[(uint)iCube].nSize;
          } while ((int)lVar7 < iVar4);
          lVar3 = (long)iVar4;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar5;
      } while (lVar5 < lVar3);
      iVar2 = ((iVar4 + -1) * iVar4) / 2;
    }
    return iVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Fxch_TabSingleDivisors( Fxch_Man_t * p, int iCube, int fAdd )
{
    Vec_Int_t * vCube = Vec_WecEntry( &p->vCubes, iCube );
    int i, k, Lit, Lit2;
    if ( Vec_IntSize(vCube) < 2 )
        return 0;
    Vec_IntForEachEntry( vCube, Lit, i )
    Vec_IntForEachEntryStart( vCube, Lit2, k, i+1 )
    {
        assert( Lit < Lit2 );
        if ( fAdd )
            Fxch_DivisorAdd( p, Lit, Lit2, 1 ), p->nPairsS++;
        else
            Fxch_DivisorRemove( p, Lit, Lit2, 1 ), p->nPairsS--;
    }
    return Vec_IntSize(vCube) * (Vec_IntSize(vCube) - 1) / 2;
}